

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jquant2.c
# Opt level: O2

void pass2_no_dither(j_decompress_ptr cinfo,JSAMPARRAY input_buf,JSAMPARRAY output_buf,int num_rows)

{
  JDIMENSION JVar1;
  _func_void_j_decompress_ptr *p_Var2;
  JSAMPROW pJVar3;
  uint c2;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  short sVar7;
  long lVar8;
  byte *pbVar9;
  
  p_Var2 = cinfo->cquantize[1].finish_pass;
  JVar1 = cinfo->output_width;
  uVar5 = 0;
  uVar4 = (ulong)(uint)num_rows;
  if (num_rows < 1) {
    uVar4 = uVar5;
  }
  for (; uVar5 != uVar4; uVar5 = uVar5 + 1) {
    pbVar9 = input_buf[uVar5];
    pJVar3 = output_buf[uVar5];
    for (lVar8 = 0; JVar1 != (JDIMENSION)lVar8; lVar8 = lVar8 + 1) {
      c2 = (uint)(pbVar9[2] >> 3);
      lVar6 = (ulong)(pbVar9[1] >> 2) * 0x40 + *(long *)(p_Var2 + (*pbVar9 & 0xfffffff8));
      sVar7 = *(short *)(lVar6 + (ulong)c2 * 2);
      if (sVar7 == 0) {
        fill_inverse_cmap(cinfo,(uint)(*pbVar9 >> 3),(uint)(pbVar9[1] >> 2),c2);
        sVar7 = *(short *)(lVar6 + (ulong)c2 * 2);
      }
      pJVar3[lVar8] = (char)sVar7 + 0xff;
      pbVar9 = pbVar9 + 3;
    }
  }
  return;
}

Assistant:

METHODDEF(void)
pass2_no_dither (j_decompress_ptr cinfo,
		 JSAMPARRAY input_buf, JSAMPARRAY output_buf, int num_rows)
/* This version performs no dithering */
{
  my_cquantize_ptr cquantize = (my_cquantize_ptr) cinfo->cquantize;
  hist3d histogram = cquantize->histogram;
  register JSAMPROW inptr, outptr;
  register histptr cachep;
  register int c0, c1, c2;
  int row;
  JDIMENSION col;
  JDIMENSION width = cinfo->output_width;

  for (row = 0; row < num_rows; row++) {
    inptr = input_buf[row];
    outptr = output_buf[row];
    for (col = width; col > 0; col--) {
      /* get pixel value and index into the cache */
      c0 = GETJSAMPLE(*inptr++) >> C0_SHIFT;
      c1 = GETJSAMPLE(*inptr++) >> C1_SHIFT;
      c2 = GETJSAMPLE(*inptr++) >> C2_SHIFT;
      cachep = & histogram[c0][c1][c2];
      /* If we have not seen this color before, find nearest colormap entry */
      /* and update the cache */
      if (*cachep == 0)
	fill_inverse_cmap(cinfo, c0,c1,c2);
      /* Now emit the colormap index for this cell */
      *outptr++ = (JSAMPLE) (*cachep - 1);
    }
  }
}